

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderMembers
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  Printer *pPVar3;
  Options *pOVar4;
  undefined1 uVar5;
  string_view local_468;
  FieldDescriptor local_458;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_400;
  basic_string_view<char,_std::char_traits<char>_> local_3f8;
  string_view local_3e8;
  string_view local_3d8;
  FieldDescriptor local_3c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_370;
  basic_string_view<char,_std::char_traits<char>_> local_368;
  string_view local_358;
  string_view local_348;
  FieldDescriptor local_338;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2e0;
  basic_string_view<char,_std::char_traits<char>_> local_2d8;
  string_view local_2c8;
  string_view local_2b8;
  FieldDescriptor local_2a8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_250;
  FieldDescriptor local_248;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_1f0;
  FieldDescriptor local_1e8;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_190;
  FieldDescriptor local_188;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_130;
  Options local_128;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_d0;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8 [2];
  Options local_88;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMessageFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"private $type$ $name$_;\n");
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_38);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_88,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_88,false,false,false);
  Options::~Options(&local_88);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a8,
             "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $get_has_field_bit_builder$;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_a8[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_d0);
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_b8,local_c8,pFVar1,local_d0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options(&local_128,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_128,false,false,false);
  Options::~Options(&local_128);
  pPVar2 = local_18;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_130);
  uVar5 = 0x28;
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public $type$ ${$get$capitalized_name$$}$()",
             "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
             "return $name$Builder_.getMessage();\n",0,local_130);
  pPVar3 = local_18;
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_188,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_188,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_188);
  pPVar2 = local_18;
  local_1e8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_190,
             (Semantic *)((long)&local_1e8.field_20 + 4));
  uVar5 = 0xe0;
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",
             "if (value == null) {\n  throw new NullPointerException();\n}\n$name$_ = value;\n",
             "$name$Builder_.setMessage(value);\n",
             "$set_has_field_bit_builder$\n$on_changed$\nreturn this;\n",local_190);
  pPVar3 = local_18;
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_1e8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_1e8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_1e8);
  pPVar2 = local_18;
  local_248.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_1f0,
             (Semantic *)((long)&local_248.field_20 + 4));
  uVar5 = 0xbb;
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x16])
            (this,pPVar2,
             "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    $type$.Builder builderForValue)"
             ,"$name$_ = builderForValue.build();\n",
             "$name$Builder_.setMessage(builderForValue.build());\n",
             "$set_has_field_bit_builder$\n$on_changed$\nreturn this;\n",local_1f0);
  pPVar3 = local_18;
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_248,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_248,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_248);
  pPVar2 = local_18;
  local_2a8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_250,
             (Semantic *)((long)&local_2a8.field_20 + 4));
  uVar5 = 0xee;
  (*(this->super_ImmutableFieldGenerator).super_FieldGenerator._vptr_FieldGenerator[0x16])
            (this,pPVar2,"$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
             "if ($get_has_field_bit_builder$ &&\n  $name$_ != null &&\n  $name$_ != $type$.getDefaultInstance()) {\n  get$capitalized_name$Builder().mergeFrom(value);\n} else {\n  $name$_ = value;\n}\n"
             ,"$name$Builder_.mergeFrom(value);\n",
             "if ($name$_ != null) {\n  $set_has_field_bit_builder$\n  $on_changed$\n}\nreturn this;\n"
             ,local_250);
  pPVar3 = local_18;
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_2a8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_2a8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_2a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2b8,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n  $name$_ = null;\n  if ($name$Builder_ != null) {\n    $name$Builder_.dispose();\n    $name$Builder_ = null;\n  }\n  $on_changed$\n  return this;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_2b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d8,"}");
  pFVar1 = this->descriptor_;
  local_338.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_2e0,(Semantic *)((long)&local_338.field_20 + 4));
  end_varname_01._M_str = local_2d8._M_str;
  end_varname_01._M_len = local_2d8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_2c8,end_varname_01,pFVar1,local_2e0);
  pPVar3 = local_18;
  uVar5 = SUB81(local_2d8._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_338,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_338,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_338);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_348,
             "$deprecation$public $type$.Builder ${$get$capitalized_name$Builder$}$() {\n  $set_has_field_bit_builder$\n  $on_changed$\n  return internalGet$capitalized_name$FieldBuilder().getBuilder();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_348);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_358,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_368,"}");
  pFVar1 = this->descriptor_;
  local_3c8.field_20.default_value_int64_t_._4_4_ = 1;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_370,(Semantic *)((long)&local_3c8.field_20 + 4));
  end_varname_00._M_str = local_368._M_str;
  end_varname_00._M_len = local_368._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_358,end_varname_00,pFVar1,local_370);
  pPVar3 = local_18;
  uVar5 = SUB81(local_368._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_3c8,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_3c8,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_3c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3d8,
             "$deprecation$public $type$OrBuilder ${$get$capitalized_name$OrBuilder$}$() {\n  if ($name$Builder_ != null) {\n    return $name$Builder_.getMessageOrBuilder();\n  } else {\n    return $name$_ == null ?\n        $type$.getDefaultInstance() : $name$_;\n  }\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_3d8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3f8,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_400);
  end_varname._M_str = local_3f8._M_str;
  end_varname._M_len = local_3f8._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_3e8,end_varname,pFVar1,local_400);
  pPVar3 = local_18;
  uVar5 = SUB81(local_3f8._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar4 = Context::options(this->context_);
  Options::Options((Options *)&local_458,pOVar4);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_458,(Options *)0x0,(bool)uVar5);
  Options::~Options((Options *)&local_458);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_468,
             "private com.google.protobuf.SingleFieldBuilder<\n    $type$, $type$.Builder, $type$OrBuilder> \n    internalGet$capitalized_name$FieldBuilder() {\n  if ($name$Builder_ == null) {\n    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n        $type$, $type$.Builder, $type$OrBuilder>(\n            get$capitalized_name$(),\n            getParentForChildren(),\n            isClean());\n    $name$_ = null;\n  }\n  return $name$Builder_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_468);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  // When using nested-builders, the code initially works just like the
  // non-nested builder case. It only creates a nested builder lazily on
  // demand and then forever delegates to it after creation.
  printer->Print(variables_, "private $type$ $name$_;\n");

  printer->Print(variables_,
                 // If this builder is non-null, it is used and the other fields
                 // are ignored.
                 "private com.google.protobuf.SingleFieldBuilder<\n"
                 "    $type$, $type$.Builder, $type$OrBuilder> $name$Builder_;"
                 "\n");

  // The comments above the methods below are based on a hypothetical
  // field of type "Field" called "Field".

  // boolean hasField()
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $get_has_field_bit_builder$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field getField()
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  PrintNestedBuilderFunction(
      printer, "$deprecation$public $type$ ${$get$capitalized_name$$}$()",
      "return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n",
      "return $name$Builder_.getMessage();\n", nullptr);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value)",

      "if (value == null) {\n"
      "  throw new NullPointerException();\n"
      "}\n"
      "$name$_ = value;\n",

      "$name$Builder_.setMessage(value);\n",

      "$set_has_field_bit_builder$\n"
      "$on_changed$\n"
      "return this;\n",
      Semantic::kSet);

  // Field.Builder setField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
      "    $type$.Builder builderForValue)",

      "$name$_ = builderForValue.build();\n",

      "$name$Builder_.setMessage(builderForValue.build());\n",

      "$set_has_field_bit_builder$\n"
      "$on_changed$\n"
      "return this;\n",
      Semantic::kSet);

  // Message.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  PrintNestedBuilderFunction(
      printer,
      "$deprecation$public Builder ${$merge$capitalized_name$$}$($type$ value)",
      "if ($get_has_field_bit_builder$ &&\n"
      "  $name$_ != null &&\n"
      "  $name$_ != $type$.getDefaultInstance()) {\n"
      "  get$capitalized_name$Builder().mergeFrom(value);\n"
      "} else {\n"
      "  $name$_ = value;\n"
      "}\n",

      "$name$Builder_.mergeFrom(value);\n",

      "if ($name$_ != null) {\n"
      "  $set_has_field_bit_builder$\n"
      "  $on_changed$\n"
      "}\n"
      "return this;\n",
      Semantic::kSet);

  // Message.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n"
      "  $name$_ = null;\n"
      "  if ($name$Builder_ != null) {\n"
      "    $name$Builder_.dispose();\n"
      "    $name$Builder_ = null;\n"
      "  }\n"
      "  $on_changed$\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // Field.Builder getFieldBuilder()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$.Builder "
                 "${$get$capitalized_name$Builder$}$() {\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return "
                 "internalGet$capitalized_name$FieldBuilder().getBuilder();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  // FieldOrBuilder getFieldOrBuilder()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "$deprecation$public $type$OrBuilder "
                 "${$get$capitalized_name$OrBuilder$}$() {\n"
                 "  if ($name$Builder_ != null) {\n"
                 "    return $name$Builder_.getMessageOrBuilder();\n"
                 "  } else {\n"
                 "    return $name$_ == null ?\n"
                 "        $type$.getDefaultInstance() : $name$_;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  // SingleFieldBuilder getFieldFieldBuilder
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "private com.google.protobuf.SingleFieldBuilder<\n"
      "    $type$, $type$.Builder, $type$OrBuilder> \n"
      "    internalGet$capitalized_name$FieldBuilder() {\n"
      "  if ($name$Builder_ == null) {\n"
      "    $name$Builder_ = new com.google.protobuf.SingleFieldBuilder<\n"
      "        $type$, $type$.Builder, $type$OrBuilder>(\n"
      "            get$capitalized_name$(),\n"
      "            getParentForChildren(),\n"
      "            isClean());\n"
      "    $name$_ = null;\n"
      "  }\n"
      "  return $name$Builder_;\n"
      "}\n");
}